

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall
icu_63::CollationFastLatinBuilder::encodeUniqueCEs
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint16_t *puVar6;
  uint uVar7;
  int offset;
  ushort uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  uprv_free_63(this->miniCEs);
  puVar6 = (uint16_t *)uprv_malloc_63((long)(this->uniqueCEs).count * 2);
  this->miniCEs = puVar6;
  if (puVar6 == (uint16_t *)0x0) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    bVar4 = false;
  }
  else {
    uVar5 = this->lastSpecialPrimaries[0];
    uVar10 = 0;
    uVar7 = 0;
    uVar13 = 0;
    uVar12 = 0;
    uVar15 = 0;
    offset = 0;
    for (lVar9 = 0; lVar9 < (this->uniqueCEs).count; lVar9 = lVar9 + 1) {
      uVar1 = (this->uniqueCEs).elements[lVar9];
      uVar14 = (uint)(uVar1 >> 0x20);
      uVar11 = (uint)uVar12;
      if (uVar15 == uVar14) {
LAB_0023700a:
        uVar12 = uVar1 >> 0x10 & 0xffff;
        if ((uint)uVar12 == uVar11) {
          uVar12 = (ulong)uVar11;
          uVar14 = uVar13;
          uVar3 = uVar7;
        }
        else if (uVar10 == 0) {
          if (uVar7 == 0) {
            uVar14 = 0;
            uVar3 = 0x180;
          }
          else {
            if (0x3df < uVar7) {
              uVar10 = 0;
              goto LAB_00237210;
            }
LAB_002371e5:
            uVar14 = 0;
            uVar3 = uVar7 + 0x20;
          }
        }
        else {
          uVar14 = 0;
          if ((uint)uVar1 < 0x5000000) {
            if (uVar7 != 0xa0) {
              if (uVar7 < 0x80) goto LAB_002371e5;
LAB_00237210:
              uVar8 = 1;
              uVar12 = (ulong)uVar11;
              goto LAB_0023721c;
            }
            uVar14 = 0;
            uVar3 = 0;
          }
          else if ((uint)uVar12 == 0x500) {
            uVar12 = 0x500;
            uVar14 = 0;
            uVar3 = 0xa0;
          }
          else {
            uVar3 = 0xc0;
            if (0xbf < uVar7) {
              if (uVar7 < 0x160) goto LAB_002371e5;
              goto LAB_00237210;
            }
          }
        }
        uVar7 = uVar3;
        if (0x500 < ((uint)uVar1 & 0x3f3f)) {
          uVar8 = 1;
          uVar13 = uVar14;
          if (6 < uVar14) goto LAB_0023721c;
          uVar14 = uVar14 + 1;
        }
        uVar13 = uVar14;
        if (uVar10 - 0xc00 < 0x3f9) {
          uVar8 = (ushort)uVar14 | (ushort)uVar10;
        }
        else {
          uVar8 = (ushort)uVar7 | (ushort)uVar10 | (ushort)uVar14;
        }
      }
      else {
        lVar16 = (long)offset;
        while (offset = (int)lVar16, uVar5 < uVar14) {
          offset = offset + 1;
          UnicodeString::setCharAt(&this->result,offset,(UChar)uVar10);
          if (2 < lVar16) {
            uVar5 = 0xffffffff;
            break;
          }
          lVar2 = lVar16 + 1;
          lVar16 = lVar16 + 1;
          uVar5 = this->lastSpecialPrimaries[lVar2];
        }
        uVar11 = 0x500;
        if (this->firstShortPrimary <= uVar14) {
          if (uVar10 < 0x1000) {
            uVar10 = 0x1000;
            uVar7 = 0xa0;
            uVar15 = uVar14;
            uVar13 = 0;
          }
          else {
            if (0xf7ff < uVar10) {
              this->shortPrimaryOverflow = '\x01';
              uVar8 = 1;
              goto LAB_0023721c;
            }
            uVar10 = uVar10 + 0x400;
            uVar7 = 0xa0;
            uVar15 = uVar14;
            uVar13 = 0;
          }
          goto LAB_0023700a;
        }
        if (uVar10 == 0) {
          uVar10 = 0xc00;
          uVar7 = 0xa0;
          uVar15 = uVar14;
          uVar13 = 0;
          goto LAB_0023700a;
        }
        uVar8 = 1;
        if (uVar10 < 0xff8) {
          uVar10 = uVar10 + 8;
          uVar7 = 0xa0;
          uVar15 = uVar14;
          uVar13 = 0;
          goto LAB_0023700a;
        }
      }
LAB_0023721c:
      this->miniCEs[lVar9] = uVar8;
    }
    bVar4 = *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
  }
  return bVar4;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }